

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void aom_highbd_blend_a64_d16_mask_avx2
               (uint8_t *dst8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  undefined1 auVar1 [32];
  char cVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  char cVar8;
  int iVar9;
  uint16_t *puVar10;
  CONV_BUF_TYPE *pCVar11;
  int iVar12;
  CONV_BUF_TYPE *pCVar13;
  int j;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m256i mask_0a;
  __m256i mask_max;
  __m256i clip_high;
  __m256i clip_low;
  __m256i v_round_offset;
  uint8_t *local_230;
  uint8_t *local_228;
  uint8_t *local_220;
  undefined1 (*local_218) [16];
  CONV_BUF_TYPE *local_210;
  uint16_t *local_200;
  short sStack_1bc;
  char cStack_19c;
  __m256i local_180;
  __m256i local_160;
  longlong local_140 [4];
  ushort local_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  ushort uStack_118;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_110;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort uStack_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  longlong local_100 [4];
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  undefined1 local_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 uStack_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 uStack_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 uStack_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined2 local_80;
  undefined2 uStack_7e;
  short sStack_7c;
  short sStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  iVar12 = conv_params->round_1 + conv_params->round_0;
  cVar8 = (char)iVar12;
  cVar2 = (byte)bd - cVar8;
  local_e0 = ((-1 << (0xdU - cVar8 & 0x1f)) + (1 << (cVar2 + 0xdU & 0x1f)) +
             (1 << (cVar2 + 0xeU & 0x1f))) * 0x40;
  iVar12 = 0x14 - iVar12;
  local_100[0] = 0;
  local_100[1] = 0;
  local_100[2] = 0;
  local_100[3] = 0;
  local_120 = ~(ushort)(-1 << ((byte)bd & 0x1f));
  local_140[0] = 0x40004000400040;
  local_140[1] = 0x40004000400040;
  local_140[2] = 0x40004000400040;
  local_140[3] = 0x40004000400040;
  local_218 = (undefined1 (*) [16])mask;
  local_200 = (uint16_t *)((long)dst8 * 2);
  local_210 = src1;
  uStack_11e = local_120;
  uStack_11c = local_120;
  uStack_11a = local_120;
  uStack_118 = local_120;
  uStack_116 = local_120;
  uStack_114 = local_120;
  uStack_112 = local_120;
  uStack_110 = local_120;
  uStack_10e = local_120;
  uStack_10c = local_120;
  uStack_10a = local_120;
  uStack_108 = local_120;
  uStack_106 = local_120;
  uStack_104 = local_120;
  uStack_102 = local_120;
  iStack_dc = local_e0;
  iStack_d8 = local_e0;
  iStack_d4 = local_e0;
  iStack_d0 = local_e0;
  iStack_cc = local_e0;
  iStack_c8 = local_e0;
  iStack_c4 = local_e0;
  if (subh == 0 && subw == 0) {
    if (w == 8) {
      lVar14 = (long)(int)mask_stride;
      sStack_1bc = (short)((int)(mask_stride << 2) >> 0x1f);
      do {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = *(ulong *)(*local_218 + lVar14);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)*local_218;
        auVar16 = vpunpcklqdq_avx(auVar16,auVar23);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(*local_218 + lVar14 * 2);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(*local_218 + lVar14 * 3);
        auVar23 = vpunpcklqdq_avx(auVar31,auVar24);
        local_180 = (__m256i)vpmovzxbw_avx2(auVar16);
        local_160 = (__m256i)vpmovzxbw_avx2(auVar23);
        highbd_blend_a64_d16_mask_w8_avx2
                  (local_200,dst_stride,src0,src0_stride,src1,src1_stride,&local_180,&local_160,
                   (__m256i *)&local_e0,iVar12,&local_100,(__m256i *)&local_120,&local_140);
        local_218 = (undefined1 (*) [16])
                    (*local_218 + CONCAT26(sStack_1bc,(int6)(int)(mask_stride << 2)));
        src1 = src1 + (int)(src1_stride * 4);
        src0 = src0 + (int)(src0_stride * 4);
        local_200 = local_200 + (int)(dst_stride * 4);
        h = h + -4;
      } while (h != 0);
    }
    else if (w == 4) {
      do {
        auVar16 = vpinsrd_avx(ZEXT416(*(uint *)*local_218),*(undefined4 *)(*local_218 + mask_stride)
                              ,1);
        auVar16 = vpinsrd_avx(auVar16,*(undefined4 *)(*local_218 + mask_stride * 2),2);
        auVar16 = vpinsrd_avx(auVar16,*(undefined4 *)(*local_218 + mask_stride * 3),3);
        local_180 = (__m256i)vpmovzxbw_avx2(auVar16);
        highbd_blend_a64_d16_mask_w4_avx2
                  (local_200,dst_stride,src0,src0_stride,src1,src1_stride,&local_180,
                   (__m256i *)&local_e0,iVar12,&local_100,(__m256i *)&local_120,&local_140);
        local_218 = (undefined1 (*) [16])(*local_218 + (mask_stride << 2));
        src1 = src1 + src1_stride * 4;
        src0 = src0 + src0_stride * 4;
        local_200 = local_200 + dst_stride * 4;
        h = h + -4;
      } while (h != 0);
    }
    else {
      local_230 = mask + (int)mask_stride;
      for (iVar9 = 0; iVar9 < h; iVar9 = iVar9 + 2) {
        puVar10 = local_200;
        pCVar11 = local_210;
        pCVar13 = src0;
        for (lVar14 = 0; lVar14 < w; lVar14 = lVar14 + 0x10) {
          local_180 = (__m256i)vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_218 + lVar14));
          local_160 = (__m256i)vpmovzxbw_avx2(*(undefined1 (*) [16])(local_230 + lVar14));
          highbd_blend_a64_d16_mask_w16_avx2
                    (puVar10,dst_stride,pCVar13,src0_stride,pCVar11,src1_stride,&local_180,
                     &local_160,(__m256i *)&local_e0,iVar12,&local_100,(__m256i *)&local_120,
                     &local_140);
          pCVar11 = pCVar11 + 0x10;
          pCVar13 = pCVar13 + 0x10;
          puVar10 = puVar10 + 0x10;
        }
        local_218 = (undefined1 (*) [16])(*local_218 + (int)(mask_stride * 2));
        local_210 = local_210 + (int)(src1_stride * 2);
        src0 = src0 + (int)(src0_stride * 2);
        local_200 = local_200 + (int)(dst_stride * 2);
        local_230 = local_230 + (int)(mask_stride * 2);
      }
    }
  }
  else if (subh == 1 && subw == 1) {
    if (w == 8) {
      lVar14 = (long)(int)mask_stride;
      cStack_19c = (char)((int)(mask_stride * 5) >> 0x1f);
      sStack_1bc = (short)((int)(mask_stride * 7) >> 0x1f);
      local_a0 = 1;
      uStack_9f = 1;
      uStack_9e = 1;
      uStack_9d = 1;
      uStack_9c = 1;
      uStack_9b = 1;
      uStack_9a = 1;
      uStack_99 = 1;
      uStack_98 = 1;
      uStack_97 = 1;
      uStack_96 = 1;
      uStack_95 = 1;
      uStack_94 = 1;
      uStack_93 = 1;
      uStack_92 = 1;
      uStack_91 = 1;
      uStack_90 = 1;
      uStack_8f = 1;
      uStack_8e = 1;
      uStack_8d = 1;
      uStack_8c = 1;
      uStack_8b = 1;
      uStack_8a = 1;
      uStack_89 = 1;
      uStack_88 = 1;
      uStack_87 = 1;
      uStack_86 = 1;
      uStack_85 = 1;
      uStack_84 = 1;
      uStack_83 = 1;
      uStack_82 = 1;
      uStack_81 = 1;
      local_c0 = 2;
      uStack_bf = 0;
      uStack_be = 2;
      uStack_bd = 0;
      uStack_bc = 2;
      uStack_bb = 0;
      uStack_ba = 2;
      uStack_b9 = 0;
      uStack_b8 = 2;
      uStack_b7 = 0;
      uStack_b6 = 2;
      uStack_b5 = 0;
      uStack_b4 = 2;
      uStack_b3 = 0;
      uStack_b2 = 2;
      uStack_b1 = 0;
      uStack_b0 = 2;
      uStack_af = 0;
      uStack_ae = 2;
      uStack_ad = 0;
      uStack_ac = 2;
      uStack_ab = 0;
      uStack_aa = 2;
      uStack_a9 = 0;
      uStack_a8 = 2;
      uStack_a7 = 0;
      uStack_a6 = 2;
      uStack_a5 = 0;
      uStack_a4 = 2;
      uStack_a3 = 0;
      uStack_a2 = 2;
      uStack_a1 = 0;
      do {
        auVar18._0_16_ =
             ZEXT116(0) * *local_218 + ZEXT116(1) * *(undefined1 (*) [16])(*local_218 + lVar14 * 2);
        auVar18._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *local_218;
        auVar26._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*local_218 + lVar14) +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_218 + lVar14 * 3);
        auVar26._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_218 + lVar14);
        auVar18 = vpaddusb_avx2(auVar18,auVar26);
        auVar6[1] = uStack_9f;
        auVar6[0] = local_a0;
        auVar6[2] = uStack_9e;
        auVar6[3] = uStack_9d;
        auVar6[4] = uStack_9c;
        auVar6[5] = uStack_9b;
        auVar6[6] = uStack_9a;
        auVar6[7] = uStack_99;
        auVar6[8] = uStack_98;
        auVar6[9] = uStack_97;
        auVar6[10] = uStack_96;
        auVar6[0xb] = uStack_95;
        auVar6[0xc] = uStack_94;
        auVar6[0xd] = uStack_93;
        auVar6[0xe] = uStack_92;
        auVar6[0xf] = uStack_91;
        auVar6[0x10] = uStack_90;
        auVar6[0x11] = uStack_8f;
        auVar6[0x12] = uStack_8e;
        auVar6[0x13] = uStack_8d;
        auVar6[0x14] = uStack_8c;
        auVar6[0x15] = uStack_8b;
        auVar6[0x16] = uStack_8a;
        auVar6[0x17] = uStack_89;
        auVar6[0x18] = uStack_88;
        auVar6[0x19] = uStack_87;
        auVar6[0x1a] = uStack_86;
        auVar6[0x1b] = uStack_85;
        auVar6[0x1c] = uStack_84;
        auVar6[0x1d] = uStack_83;
        auVar6[0x1e] = uStack_82;
        auVar6[0x1f] = uStack_81;
        auVar18 = vpmaddubsw_avx2(auVar18,auVar6);
        auVar1[1] = uStack_bf;
        auVar1[0] = local_c0;
        auVar1[2] = uStack_be;
        auVar1[3] = uStack_bd;
        auVar1[4] = uStack_bc;
        auVar1[5] = uStack_bb;
        auVar1[6] = uStack_ba;
        auVar1[7] = uStack_b9;
        auVar1[8] = uStack_b8;
        auVar1[9] = uStack_b7;
        auVar1[10] = uStack_b6;
        auVar1[0xb] = uStack_b5;
        auVar1[0xc] = uStack_b4;
        auVar1[0xd] = uStack_b3;
        auVar1[0xe] = uStack_b2;
        auVar1[0xf] = uStack_b1;
        auVar1[0x10] = uStack_b0;
        auVar1[0x11] = uStack_af;
        auVar1[0x12] = uStack_ae;
        auVar1[0x13] = uStack_ad;
        auVar1[0x14] = uStack_ac;
        auVar1[0x15] = uStack_ab;
        auVar1[0x16] = uStack_aa;
        auVar1[0x17] = uStack_a9;
        auVar1[0x18] = uStack_a8;
        auVar1[0x19] = uStack_a7;
        auVar1[0x1a] = uStack_a6;
        auVar1[0x1b] = uStack_a5;
        auVar1[0x1c] = uStack_a4;
        auVar1[0x1d] = uStack_a3;
        auVar1[0x1e] = uStack_a2;
        auVar1[0x1f] = uStack_a1;
        auVar18 = vpaddw_avx2(auVar18,auVar1);
        local_180 = (__m256i)vpsrlw_avx2(auVar18,2);
        auVar19._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*local_218 + (int)(mask_stride * 4)) +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_218 + (int)(mask_stride * 6));
        auVar19._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*local_218 + (int)(mask_stride * 4));
        auVar27._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])
              (*local_218 +
              CONCAT17(cStack_19c,
                       CONCAT16(cStack_19c,CONCAT15(cStack_19c,(int5)(int)(mask_stride * 5))))) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*local_218 + CONCAT26(sStack_1bc,(int6)(int)(mask_stride * 7)));
        auVar27._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])
              (*local_218 +
              CONCAT17(cStack_19c,
                       CONCAT16(cStack_19c,CONCAT15(cStack_19c,(int5)(int)(mask_stride * 5)))));
        auVar18 = vpaddusb_avx2(auVar19,auVar27);
        auVar18 = vpmaddubsw_avx2(auVar18,auVar6);
        auVar18 = vpaddw_avx2(auVar18,auVar1);
        local_160 = (__m256i)vpsrlw_avx2(auVar18,2);
        highbd_blend_a64_d16_mask_w8_avx2
                  (local_200,dst_stride,src0,src0_stride,src1,src1_stride,&local_180,&local_160,
                   (__m256i *)&local_e0,iVar12,&local_100,(__m256i *)&local_120,&local_140);
        local_218 = (undefined1 (*) [16])(*local_218 + (int)(mask_stride << 3));
        src1 = src1 + (int)(src1_stride * 4);
        src0 = src0 + (int)(src0_stride * 4);
        local_200 = local_200 + (int)(dst_stride * 4);
        h = h + -4;
      } while (h != 0);
    }
    else if (w == 4) {
      lVar14 = (ulong)(src1_stride * 4) * 2;
      local_a0 = (undefined1)lVar14;
      uStack_9f = (undefined1)((ulong)lVar14 >> 8);
      uStack_9e = (undefined1)((ulong)lVar14 >> 0x10);
      uStack_9d = (undefined1)((ulong)lVar14 >> 0x18);
      uStack_9c = (undefined1)((ulong)lVar14 >> 0x20);
      uStack_9b = 0;
      uStack_9a = 0;
      uStack_99 = 0;
      local_c0 = 1;
      uStack_bf = 1;
      uStack_be = 1;
      uStack_bd = 1;
      uStack_bc = 1;
      uStack_bb = 1;
      uStack_ba = 1;
      uStack_b9 = 1;
      uStack_b8 = 1;
      uStack_b7 = 1;
      uStack_b6 = 1;
      uStack_b5 = 1;
      uStack_b4 = 1;
      uStack_b3 = 1;
      uStack_b2 = 1;
      uStack_b1 = 1;
      uStack_b0 = 1;
      uStack_af = 1;
      uStack_ae = 1;
      uStack_ad = 1;
      uStack_ac = 1;
      uStack_ab = 1;
      uStack_aa = 1;
      uStack_a9 = 1;
      uStack_a8 = 1;
      uStack_a7 = 1;
      uStack_a6 = 1;
      uStack_a5 = 1;
      uStack_a4 = 1;
      uStack_a3 = 1;
      uStack_a2 = 1;
      uStack_a1 = 1;
      local_80 = 2;
      uStack_7e = 2;
      sStack_7c = 2;
      sStack_7a = 2;
      uStack_78 = 2;
      uStack_76 = 2;
      uStack_74 = 2;
      uStack_72 = 2;
      uStack_70 = 2;
      uStack_6e = 2;
      uStack_6c = 2;
      uStack_6a = 2;
      uStack_68 = 2;
      uStack_66 = 2;
      uStack_64 = 2;
      uStack_62 = 2;
      do {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(*local_218 + mask_stride * 6);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(*local_218 + mask_stride * 4);
        auVar16 = vpunpcklqdq_avx(auVar20,auVar15);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(*local_218 + mask_stride * 2);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)*local_218;
        auVar23 = vpunpcklqdq_avx(auVar28,auVar21);
        auVar17._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar23;
        auVar17._16_16_ = ZEXT116(1) * auVar16;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(*local_218 + mask_stride * 7);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(*local_218 + mask_stride * 5);
        auVar16 = vpunpcklqdq_avx(auVar29,auVar22);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(*local_218 + mask_stride * 3);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(*local_218 + mask_stride);
        auVar23 = vpunpcklqdq_avx(auVar32,auVar30);
        auVar25._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar23;
        auVar25._16_16_ = ZEXT116(1) * auVar16;
        auVar18 = vpaddusb_avx2(auVar17,auVar25);
        auVar5[1] = uStack_bf;
        auVar5[0] = local_c0;
        auVar5[2] = uStack_be;
        auVar5[3] = uStack_bd;
        auVar5[4] = uStack_bc;
        auVar5[5] = uStack_bb;
        auVar5[6] = uStack_ba;
        auVar5[7] = uStack_b9;
        auVar5[8] = uStack_b8;
        auVar5[9] = uStack_b7;
        auVar5[10] = uStack_b6;
        auVar5[0xb] = uStack_b5;
        auVar5[0xc] = uStack_b4;
        auVar5[0xd] = uStack_b3;
        auVar5[0xe] = uStack_b2;
        auVar5[0xf] = uStack_b1;
        auVar5[0x10] = uStack_b0;
        auVar5[0x11] = uStack_af;
        auVar5[0x12] = uStack_ae;
        auVar5[0x13] = uStack_ad;
        auVar5[0x14] = uStack_ac;
        auVar5[0x15] = uStack_ab;
        auVar5[0x16] = uStack_aa;
        auVar5[0x17] = uStack_a9;
        auVar5[0x18] = uStack_a8;
        auVar5[0x19] = uStack_a7;
        auVar5[0x1a] = uStack_a6;
        auVar5[0x1b] = uStack_a5;
        auVar5[0x1c] = uStack_a4;
        auVar5[0x1d] = uStack_a3;
        auVar5[0x1e] = uStack_a2;
        auVar5[0x1f] = uStack_a1;
        auVar18 = vpmaddubsw_avx2(auVar18,auVar5);
        auVar7._2_2_ = uStack_7e;
        auVar7._0_2_ = local_80;
        auVar7._4_2_ = sStack_7c;
        auVar7._6_2_ = sStack_7a;
        auVar7._8_2_ = uStack_78;
        auVar7._10_2_ = uStack_76;
        auVar7._12_2_ = uStack_74;
        auVar7._14_2_ = uStack_72;
        auVar7._16_2_ = uStack_70;
        auVar7._18_2_ = uStack_6e;
        auVar7._20_2_ = uStack_6c;
        auVar7._22_2_ = uStack_6a;
        auVar7._24_2_ = uStack_68;
        auVar7._26_2_ = uStack_66;
        auVar7._28_2_ = uStack_64;
        auVar7._30_2_ = uStack_62;
        auVar18 = vpaddw_avx2(auVar18,auVar7);
        local_180 = (__m256i)vpsrlw_avx2(auVar18,2);
        highbd_blend_a64_d16_mask_w4_avx2
                  (local_200,dst_stride,src0,src0_stride,src1,src1_stride,&local_180,
                   (__m256i *)&local_e0,iVar12,&local_100,(__m256i *)&local_120,&local_140);
        local_218 = (undefined1 (*) [16])(*local_218 + (mask_stride << 3));
        src1 = (CONV_BUF_TYPE *)
               ((long)src1 +
               CONCAT17(uStack_99,
                        CONCAT16(uStack_9a,
                                 CONCAT15(uStack_9b,
                                          CONCAT14(uStack_9c,
                                                   CONCAT13(uStack_9d,
                                                            CONCAT12(uStack_9e,
                                                                     CONCAT11(uStack_9f,local_a0))))
                                         ))));
        src0 = src0 + src0_stride * 4;
        local_200 = local_200 + dst_stride * 4;
        h = h + -4;
      } while (h != 0);
    }
    else {
      iVar9 = mask_stride << 2;
      local_80 = (undefined2)iVar9;
      uStack_7e = (undefined2)((uint)iVar9 >> 0x10);
      sStack_7c = (short)(iVar9 >> 0x1f);
      lVar14 = (long)(int)(src1_stride * 2) * 2;
      local_c0 = (undefined1)lVar14;
      uStack_bf = (undefined1)((ulong)lVar14 >> 8);
      uStack_be = (undefined1)((ulong)lVar14 >> 0x10);
      uStack_bd = (undefined1)((ulong)lVar14 >> 0x18);
      uStack_bc = (undefined1)((ulong)lVar14 >> 0x20);
      uStack_bb = (undefined1)((ulong)lVar14 >> 0x28);
      uStack_ba = (undefined1)((ulong)lVar14 >> 0x30);
      uStack_b9 = (undefined1)((ulong)lVar14 >> 0x38);
      lVar14 = (long)(int)(src0_stride * 2) * 2;
      local_a0 = (undefined1)lVar14;
      uStack_9f = (undefined1)((ulong)lVar14 >> 8);
      uStack_9e = (undefined1)((ulong)lVar14 >> 0x10);
      uStack_9d = (undefined1)((ulong)lVar14 >> 0x18);
      uStack_9c = (undefined1)((ulong)lVar14 >> 0x20);
      uStack_9b = (undefined1)((ulong)lVar14 >> 0x28);
      uStack_9a = (undefined1)((ulong)lVar14 >> 0x30);
      uStack_99 = (undefined1)((ulong)lVar14 >> 0x38);
      local_228 = mask + (int)(mask_stride * 3);
      local_220 = mask + (int)(mask_stride * 2);
      local_230 = mask + (int)mask_stride;
      sStack_7a = sStack_7c;
      for (iVar9 = 0; iVar9 < h; iVar9 = iVar9 + 2) {
        pCVar11 = local_210;
        pCVar13 = src0;
        puVar10 = local_200;
        for (lVar14 = 0; lVar14 < w; lVar14 = lVar14 + 0x10) {
          auVar18 = vpaddusb_avx2(*(undefined1 (*) [32])(*local_218 + lVar14 * 2),
                                  *(undefined1 (*) [32])(local_230 + lVar14 * 2));
          auVar1 = vpaddusb_avx2(*(undefined1 (*) [32])(local_220 + lVar14 * 2),
                                 *(undefined1 (*) [32])(local_228 + lVar14 * 2));
          auVar4[8] = 1;
          auVar4._0_8_ = 0x101010101010101;
          auVar4[9] = 1;
          auVar4[10] = 1;
          auVar4[0xb] = 1;
          auVar4[0xc] = 1;
          auVar4[0xd] = 1;
          auVar4[0xe] = 1;
          auVar4[0xf] = 1;
          auVar4[0x10] = 1;
          auVar4[0x11] = 1;
          auVar4[0x12] = 1;
          auVar4[0x13] = 1;
          auVar4[0x14] = 1;
          auVar4[0x15] = 1;
          auVar4[0x16] = 1;
          auVar4[0x17] = 1;
          auVar4[0x18] = 1;
          auVar4[0x19] = 1;
          auVar4[0x1a] = 1;
          auVar4[0x1b] = 1;
          auVar4[0x1c] = 1;
          auVar4[0x1d] = 1;
          auVar4[0x1e] = 1;
          auVar4[0x1f] = 1;
          auVar18 = vpmaddubsw_avx2(auVar18,auVar4);
          auVar1 = vpmaddubsw_avx2(auVar1,auVar4);
          auVar3._8_2_ = 2;
          auVar3._0_8_ = 0x2000200020002;
          auVar3._10_2_ = 2;
          auVar3._12_2_ = 2;
          auVar3._14_2_ = 2;
          auVar3._16_2_ = 2;
          auVar3._18_2_ = 2;
          auVar3._20_2_ = 2;
          auVar3._22_2_ = 2;
          auVar3._24_2_ = 2;
          auVar3._26_2_ = 2;
          auVar3._28_2_ = 2;
          auVar3._30_2_ = 2;
          auVar18 = vpaddw_avx2(auVar18,auVar3);
          local_180 = (__m256i)vpsrlw_avx2(auVar18,2);
          auVar18 = vpaddw_avx2(auVar1,auVar3);
          local_160 = (__m256i)vpsrlw_avx2(auVar18,2);
          highbd_blend_a64_d16_mask_w16_avx2
                    (puVar10,dst_stride,pCVar13,src0_stride,pCVar11,src1_stride,&local_180,
                     &local_160,(__m256i *)&local_e0,iVar12,&local_100,(__m256i *)&local_120,
                     &local_140);
          pCVar11 = pCVar11 + 0x10;
          pCVar13 = pCVar13 + 0x10;
          puVar10 = puVar10 + 0x10;
        }
        lVar14 = CONCAT26(sStack_7a,CONCAT24(sStack_7c,CONCAT22(uStack_7e,local_80)));
        local_218 = (undefined1 (*) [16])(*local_218 + lVar14);
        local_210 = (CONV_BUF_TYPE *)
                    ((long)local_210 +
                    CONCAT17(uStack_b9,
                             CONCAT16(uStack_ba,
                                      CONCAT15(uStack_bb,
                                               CONCAT14(uStack_bc,
                                                        CONCAT13(uStack_bd,
                                                                 CONCAT12(uStack_be,
                                                                          CONCAT11(uStack_bf,
                                                                                   local_c0))))))));
        src0 = (CONV_BUF_TYPE *)
               ((long)src0 +
               CONCAT17(uStack_99,
                        CONCAT16(uStack_9a,
                                 CONCAT15(uStack_9b,
                                          CONCAT14(uStack_9c,
                                                   CONCAT13(uStack_9d,
                                                            CONCAT12(uStack_9e,
                                                                     CONCAT11(uStack_9f,local_a0))))
                                         ))));
        local_200 = local_200 + (int)(dst_stride * 2);
        local_228 = local_228 + lVar14;
        local_220 = local_220 + lVar14;
        local_230 = local_230 + lVar14;
      }
    }
  }
  else {
    aom_highbd_blend_a64_d16_mask_c
              (dst8,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,subw,subh,
               conv_params,bd);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_avx2(
    uint8_t *dst8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int32_t round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;
  const __m256i v_round_offset = _mm256_set1_epi32(round_offset);
  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;

  const __m256i clip_low = _mm256_setzero_si256();
  const __m256i clip_high = _mm256_set1_epi16((1 << bd) - 1);
  const __m256i mask_max = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw0_subh0_w4_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw0_subh0_w8_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >= 16
        highbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw1_subh1_w4_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw1_subh1_w8_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >= 16
        highbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }
  } else {
    // Sub-sampling in only one axis doesn't seem to happen very much, so fall
    // back to the vanilla C implementation instead of having all the optimised
    // code for these.
    aom_highbd_blend_a64_d16_mask_c(dst8, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, w, h, subw,
                                    subh, conv_params, bd);
  }
}